

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RegexPattern::pattern(UnicodeString *__return_storage_ptr__,RegexPattern *this)

{
  int32_t minCapacity;
  int64_t limit;
  char16_t *dest;
  UErrorCode status;
  UErrorCode local_2c;
  
  if (this->fPatternString == (UnicodeString *)0x0) {
    if (this->fPattern == (UText *)0x0) {
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_00471e80;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    else {
      local_2c = U_ZERO_ERROR;
      limit = utext_nativeLength_63(this->fPattern);
      minCapacity = utext_extract_63(this->fPattern,0,limit,(UChar *)0x0,0,&local_2c);
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_00471e80;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      local_2c = U_ZERO_ERROR;
      dest = icu_63::UnicodeString::getBuffer(__return_storage_ptr__,minCapacity);
      utext_extract_63(this->fPattern,0,limit,dest,minCapacity,&local_2c);
      icu_63::UnicodeString::releaseBuffer(__return_storage_ptr__,minCapacity);
    }
  }
  else {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,this->fPatternString);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexPattern::pattern() const {
    if (fPatternString != NULL) {
        return *fPatternString;
    } else if (fPattern == NULL) {
        return UnicodeString();
    } else {
        UErrorCode status = U_ZERO_ERROR;
        int64_t nativeLen = utext_nativeLength(fPattern);
        int32_t len16 = utext_extract(fPattern, 0, nativeLen, NULL, 0, &status); // buffer overflow error
        UnicodeString result;

        status = U_ZERO_ERROR;
        UChar *resultChars = result.getBuffer(len16);
        utext_extract(fPattern, 0, nativeLen, resultChars, len16, &status); // unterminated warning
        result.releaseBuffer(len16);

        return result;
    }
}